

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_XMLNode * __thiscall ON_PostEffect::CImpl::PepNode(CImpl *this)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  ON_XMLNode *this_00;
  undefined4 extraout_var;
  ON_XMLNode *local_30;
  ON_XMLNode *pep_node;
  ON_XMLNode *pep_type_node;
  ON_XMLNode *post_effects_node;
  CImpl *this_local;
  
  if (this->_collection == (ON_PostEffects *)0x0) {
    if (this->_local_node == (ON_XMLNode *)0x0) {
      pOVar2 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar2,L"plug-in");
      this->_local_node = pOVar2;
    }
    this_local = (CImpl *)this->_local_node;
  }
  else {
    pOVar2 = ON_PostEffects::WritablePostEffectsNode(this->_collection);
    pOVar2 = GetPostEffectTypeNode(pOVar2,this->_type);
    if (pOVar2 == (ON_XMLNode *)0x0) {
      this_local = (CImpl *)0x0;
    }
    else {
      local_30 = FindPostEffectNodeForId(pOVar2,&this->_id);
      if (local_30 == (ON_XMLNode *)0x0) {
        this_00 = (ON_XMLNode *)operator_new(0xe8);
        ON_XMLNode::ON_XMLNode(this_00,L"plug-in");
        iVar1 = (*pOVar2->_vptr_ON_XMLNode[0xb])(pOVar2,this_00);
        local_30 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
      }
      this_local = (CImpl *)local_30;
    }
  }
  return (ON_XMLNode *)this_local;
}

Assistant:

ON_XMLNode* ON_PostEffect::CImpl::PepNode(void) const
{
  if (nullptr != _collection)
  {
    ON_XMLNode& post_effects_node = _collection->WritablePostEffectsNode();
    ON_XMLNode* pep_type_node = GetPostEffectTypeNode(post_effects_node, _type);
    if (nullptr == pep_type_node)
      return nullptr;

    ON_XMLNode* pep_node = FindPostEffectNodeForId(*pep_type_node, _id);
    if (nullptr == pep_node)
    {
      pep_node = pep_type_node->AttachChildNode(new ON_XMLNode(ON_RDK_PEP_PLUG_IN));
    }

    return pep_node;
  }

  // This post effect is not a member of a collection; it's free-floating so we need to use
  // a local node to hold its state.
  if (nullptr == _local_node)
    _local_node = new ON_XMLNode(ON_RDK_PEP_PLUG_IN);

  return _local_node;
}